

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

void __thiscall
MipsMacroCommand::MipsMacroCommand
          (MipsMacroCommand *this,
          unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *content,
          int macroFlags)

{
  bool bVar1;
  int macroFlags_local;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *content_local;
  MipsMacroCommand *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__MipsMacroCommand_002abee0;
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<std::default_delete<CAssemblerCommand>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)&this->content)
  ;
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
            (&this->content,content);
  this->macroFlags = macroFlags;
  bVar1 = CMipsArchitecture::GetIgnoreDelay(&Mips);
  this->IgnoreLoadDelay = bVar1;
  return;
}

Assistant:

MipsMacroCommand::MipsMacroCommand(std::unique_ptr<CAssemblerCommand> content, int macroFlags)
{
	this->content = std::move(content);
	this->macroFlags = macroFlags;
	IgnoreLoadDelay = Mips.GetIgnoreDelay();
}